

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    run_repl();
  }
  else if (argc == 2) {
    run_file(argv[1]);
  }
  else {
    fprintf(_stderr,"Usage: calc");
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    if (argc == 1) {
        run_repl();
    } else if (argc == 2) {
        run_file(argv[1]);
    } else {
        fprintf(stderr, "Usage: calc");
    }

    return 0;
}